

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O3

bool __thiscall TcpSocketTest::handleAccept(TcpSocketTest *this,Socket *s)

{
  JetHead::Socket::setSelector((SocketListener *)s,(Selector *)&this->super_SocketListener);
  return true;
}

Assistant:

bool TcpSocketTest::handleAccept( Socket *s ) 
{
  //cerr << "accept" <<endl;
  LOG_NOTICE( "called" );
  // Do this becaue setSelector has different behavior
  // depending on if we are connected or not.
  s->setSelector( this, mSelector );
	return true;
}